

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::rootdevice::~rootdevice(rootdevice *this)

{
  rootdevice *this_local;
  
  ::std::shared_ptr<libtorrent::aux::http_connection>::~shared_ptr(&this->upnp_connection);
  ::std::__cxx11::string::~string((string *)&this->path);
  ::std::__cxx11::string::~string((string *)&this->hostname);
  libtorrent::aux::
  container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  ::~container_wrapper(&this->mapping);
  ::std::__cxx11::string::~string((string *)&this->service_namespace);
  ::std::__cxx11::string::~string((string *)&this->control_url);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

upnp::rootdevice::~rootdevice() = default;